

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

return_type_conflict1 * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__26&>
          (return_type_conflict1 *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  anon_class_1_0_00000001 *in_RCX;
  anon_class_1_0_00000001 *fn_local;
  impl<ezy::strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>_>
  *this_local;
  
  _impl::
  and_then<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__26&>
            (__return_storage_ptr__,(_impl *)this,
             (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
              *)fn,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }